

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bug-007.cc
# Opt level: O2

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  shared_ptr<tchecker::parsing::system_declaration_t> sVar2;
  shared_ptr<tchecker::parsing::system_declaration_t> sysdecl;
  string model;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&model,"system:foo\n",(allocator<char> *)&sysdecl);
  sVar2 = tchecker::test::parse((test *)&sysdecl,&model);
  if (sysdecl.
      super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    poVar1 = tchecker::parsing::operator<<
                       ((parsing *)&std::cout,
                        (ostream *)
                        sysdecl.
                        super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(declaration_t *)
                                sVar2.
                                super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi._M_pi);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sysdecl.
                super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&model);
    return 0;
  }
  __assert_fail("sysdecl != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/test/bugfixes/bug-007.cc"
                ,0xd,"int main(int, char **)");
}

Assistant:

int main(int /*argc*/, char ** /*argv*/)
{
  std::string model = "system:foo\n";

  std::shared_ptr<tchecker::parsing::system_declaration_t> sysdecl{tchecker::test::parse(model)};

  assert(sysdecl != nullptr);
  std::cout << *sysdecl << std::endl;

  return 0;
}